

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool DerBase::DecodeSet<CrlValidatedID>
               (uchar *pIn,size_t cbIn,size_t *cbUsed,
               vector<CrlValidatedID,_std::allocator<CrlValidatedID>_> *out)

{
  bool bVar1;
  size_t sStack_38;
  bool ret;
  size_t cbSize;
  size_t cbPrefix;
  vector<CrlValidatedID,_std::allocator<CrlValidatedID>_> *out_local;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  
  cbSize = 0;
  sStack_38 = 0;
  cbPrefix = (size_t)out;
  out_local = (vector<CrlValidatedID,_std::allocator<CrlValidatedID>_> *)cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  bVar1 = DecodeSetOrSequenceOf<CrlValidatedID>
                    (ConstructedSet,pIn,cbIn,&cbSize,&stack0xffffffffffffffc8,out);
  if (bVar1) {
    *(size_t *)out_local = cbSize + sStack_38;
  }
  return bVar1;
}

Assistant:

static bool DecodeSet(const unsigned char* pIn, size_t cbIn, size_t& cbUsed, std::vector<T>& out)
	{
		size_t cbPrefix = 0;
		size_t cbSize = 0;
		bool ret = DecodeSetOrSequenceOf(DerType::ConstructedSet, pIn, cbIn, cbPrefix, cbSize, out);

		if (ret)
			cbUsed = cbPrefix + cbSize;

		return ret;
	}